

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_data_get_length_in_pcm_frames
                    (ma_paged_audio_buffer_data *pData,ma_uint64 *pLength)

{
  ma_paged_audio_buffer_page *pPage;
  ma_uint64 *pLength_local;
  ma_paged_audio_buffer_data *pData_local;
  ma_result local_34;
  
  if (pLength == (ma_uint64 *)0x0) {
    local_34 = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0;
    if (pData == (ma_paged_audio_buffer_data *)0x0) {
      local_34 = MA_INVALID_ARGS;
    }
    else {
      for (pPage = (pData->head).pNext; pPage != (ma_paged_audio_buffer_page *)0x0;
          pPage = pPage->pNext) {
        *pLength = pPage->sizeInFrames + *pLength;
      }
      local_34 = MA_SUCCESS;
    }
  }
  return local_34;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_get_length_in_pcm_frames(ma_paged_audio_buffer_data* pData, ma_uint64* pLength)
{
    ma_paged_audio_buffer_page* pPage;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Calculate the length from the linked list. */
    for (pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pData->head.pNext); pPage != NULL; pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPage->pNext)) {
        *pLength += pPage->sizeInFrames;
    }

    return MA_SUCCESS;
}